

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_ui.cpp
# Opt level: O2

bool InitError(bilingual_str *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *details)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff08;
  string local_c8 [32];
  bilingual_str local_a8;
  bilingual_str local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = (details->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (details->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    bilingual_str::bilingual_str(&local_68,str);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,"%s:\n%s",(allocator<char> *)&stack0xffffffffffffff17);
    Untranslated(&local_a8,in_stack_ffffffffffffff08);
    util::MakeUnorderedList((string *)&stack0xffffffffffffff18,details);
    tinyformat::format<bilingual_str,std::__cxx11::string>
              (&local_68,(tinyformat *)&local_a8,str,(bilingual_str *)&stack0xffffffffffffff18,in_R8
              );
  }
  InitError(&local_68);
  bilingual_str::~bilingual_str(&local_68);
  if (pbVar1 != pbVar2) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    bilingual_str::~bilingual_str(&local_a8);
    std::__cxx11::string::~string(local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool InitError(const bilingual_str& str, const std::vector<std::string>& details)
{
    // For now just flatten the list of error details into a string to pass to
    // the base InitError overload. In the future, if more init code provides
    // error details, the details could be passed separately from the main
    // message for rich display in the GUI. But currently the only init
    // functions which provide error details are ones that run during early init
    // before the GUI uiInterface is registered, so there's no point passing
    // main messages and details separately to uiInterface yet.
    return InitError(details.empty() ? str : strprintf(Untranslated("%s:\n%s"), str, MakeUnorderedList(details)));
}